

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libnbt.h
# Opt level: O1

void __thiscall libnbt::NBTTagData<short>::setType(NBTTagData<short> *this)

{
  int iVar1;
  char cVar2;
  
  cVar2 = '\x01';
  if (_widen != _get) {
    if (*_widen != '*') {
      iVar1 = strcmp(_widen,_get);
      if (iVar1 == 0) goto LAB_00104383;
    }
    cVar2 = '\x02';
  }
LAB_00104383:
  (this->super_NBTBase).type = cVar2;
  return;
}

Assistant:

void setType() {
            if (typeid(T) == typeid(int8_t)) {
                type = BYTE;
            } else if (typeid(T) == typeid(int16_t)) {
                type = SHORT;
            } else if (typeid(T) == typeid(int32_t)) {
                type = INT;
            } else if (typeid(T) == typeid(int64_t)) {
                type = LONG;
            } else if (typeid(T) == typeid(float)) {
                type = FLOAT;
            } else if (typeid(T) == typeid(double)) {
                type = DOUBLE;
            } else if (typeid(T) == typeid(std::string)) {
                type = STRING;
            } else {
                type = END;
            }
        }